

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

void Bmc_CexCareBits2_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pObj_00;
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar2 = *(ulong *)pObj;
  if (((byte)(uVar2 >> 0x3e) & 1) == 0 && (~uVar2 & 0x1fffffff1fffffff) != 0) {
    while( true ) {
      *(ulong *)pObj = uVar2 | 0x4000000000000000;
      uVar1 = (uint)uVar2;
      if ((~uVar1 & 0x9fffffff) == 0) break;
      if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                      ,0x211,"void Bmc_CexCareBits2_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      pObj_00 = pObj + -(ulong)(uVar1 & 0x1fffffff);
      uVar3 = (uint)(*(ulong *)pObj_00 >> 0x1e) & 1;
      uVar4 = (uint)(uVar2 >> 0x1d) & 1;
      uVar7 = (uint)(uVar2 >> 0x20);
      uVar5 = (ulong)(uVar7 & 0x1fffffff);
      uVar6 = (uint)(*(ulong *)(pObj + -uVar5) >> 0x1e) & 1;
      uVar7 = uVar7 >> 0x1d & 1;
      if ((uVar1 >> 0x1e & 1) == 0) {
        if ((uVar3 != uVar4) && (uVar6 != uVar7)) {
          __assert_fail("fCompl0 == 0 || fCompl1 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                        ,0x21c,"void Bmc_CexCareBits2_rec(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar2 = *(ulong *)(pObj + -uVar5);
        if (uVar3 == uVar4) {
          uVar2 = *(ulong *)pObj_00;
        }
        pObj = pObj + -uVar5;
        if (uVar3 == uVar4) {
          pObj = pObj_00;
        }
      }
      else {
        if ((uVar3 == uVar4) || (uVar6 == uVar7)) {
          __assert_fail("fCompl0 == 1 && fCompl1 == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                        ,0x216,"void Bmc_CexCareBits2_rec(Gia_Man_t *, Gia_Obj_t *)");
        }
        Bmc_CexCareBits2_rec(p,pObj_00);
        uVar2 = *(ulong *)(pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
        pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      }
      if ((~uVar2 & 0x1fffffff1fffffff) == 0) {
        return;
      }
      if ((uVar2 & 0x4000000000000000) != 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

void Bmc_CexCareBits2_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int fCompl0, fCompl1;
    if ( Gia_ObjIsConst0(pObj) )
        return;
    if ( pObj->fMark1 )
        return;
    pObj->fMark1 = 1;
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
    if ( pObj->fMark0 )
    {
        assert( fCompl0 == 1 && fCompl1 == 1 );
        Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(pObj) );
        Bmc_CexCareBits2_rec( p, Gia_ObjFanin1(pObj) );
    }
    else
    {
        assert( fCompl0 == 0 || fCompl1 == 0 );
        if ( fCompl0 == 0 )
            Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(pObj) );
        /**/ 
        else 
        /**/ 
        if ( fCompl1 == 0 )
            Bmc_CexCareBits2_rec( p, Gia_ObjFanin1(pObj) );
    }
}